

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_mul_v_uint64_192_960(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  block_t *in_RDX;
  ulong *in_RSI;
  long in_RDI;
  uint j;
  word mask;
  uint i;
  word idx;
  uint w;
  block_t *Ablock;
  word *vptr;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar1;
  int local_3c;
  ulong local_38;
  int local_2c;
  block_t *local_28;
  ulong *local_20;
  
  clear_uint64_blocks((block_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac);
  clear_uint64_block((block_t *)(in_RDI + 0x60),3);
  local_28 = in_RDX;
  local_20 = in_RSI;
  for (local_2c = 3; local_2c != 0; local_2c = local_2c + -1) {
    local_38 = *local_20;
    for (local_3c = 0x40; local_3c != 0; local_3c = local_3c + -1) {
      for (uVar1 = 0; uVar1 < 3; uVar1 = uVar1 + 1) {
        mzd_xor_mask_uint64_block
                  ((block_t *)(in_RDI + (ulong)uVar1 * 0x20),local_28,-(local_38 & 1),4);
        local_28 = local_28 + 1;
      }
      mzd_xor_mask_uint64_block((block_t *)(in_RDI + 0x60),local_28,-(local_38 & 1),3);
      local_38 = local_38 >> 1;
      local_28 = local_28 + 1;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void mzd_mul_v_uint64_192_960(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  clear_uint64_blocks(BLOCK(c, 0), 3);
  clear_uint64_block(BLOCK(c, 3), 3);

  for (unsigned int w = 3; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; --i, idx >>= 1, ++Ablock) {
      const word mask = -(idx & 1);
      for (unsigned int j = 0; j < 3; ++j, ++Ablock) {
        mzd_xor_mask_uint64_block(BLOCK(c, j), Ablock, mask, 4);
      }
      mzd_xor_mask_uint64_block(BLOCK(c, 3), Ablock, mask, 3);
    }
  }
}